

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::table_name_collector::operator()
          (table_name_collector *this,
          offset_in_Stream_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          param_2,string *alias)

{
  bool bVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::type_index)>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_RDI;
  type_index __args;
  type_index local_80;
  string local_78 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  bVar1 = std::function::operator_cast_to_bool
                    ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::type_index)>
                      *)0x23e5a6);
  if (bVar1) {
    this_00 = (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::type_index)>
               *)(in_RDI + 0x20);
    std::type_index::type_index(&local_80,(type_info *)&relive::Stream::typeinfo);
    __args._M_target = (type_info *)local_78;
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::type_index)>
    ::operator()(this_00,__args);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (&local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args._M_target
               ,in_RDX);
    std::
    set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::insert((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_RDX,(value_type *)__args._M_target);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_58);
    std::__cxx11::string::~string(local_78);
  }
  return;
}

Assistant:

void operator()(F O::*, std::string alias = {}) const {
        if(this->find_table_name) {
            table_names.insert(std::make_pair(this->find_table_name(typeid(O)), move(alias)));
        }
    }